

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::anon_unknown_36::HttpOutputStream::flush(HttpOutputStream *this)

{
  long in_RSI;
  ForkedPromise<void> fork;
  char *local_30;
  char *pcStack_28;
  Event **local_20;
  
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_28 = "flush";
  local_20 = (Event **)0x1100000934;
  Promise<void>::fork((Promise<void> *)&stack0xffffffffffffffc0);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0x10),
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffb8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffb8);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose
            ((Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)&stack0xffffffffffffffc0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> flush() {
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();
    return fork.addBranch();
  }